

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O3

bool __thiscall CorUnix::CPalThread::WaitForStartStatus(CPalThread *this)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  __mutex = &this->m_startMutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","WaitForStartStatus",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x88f);
    fprintf(_stderr,"pthread primitive failure\n");
  }
  if (this->m_fStartStatusSet == false) {
    do {
      iVar1 = pthread_cond_wait((pthread_cond_t *)&this->m_startCond,(pthread_mutex_t *)__mutex);
      if (iVar1 != 0) {
        fprintf(_stderr,"] %s %s:%d","WaitForStartStatus",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
                ,0x898);
        fprintf(_stderr,"pthread primitive failure\n");
      }
    } while (this->m_fStartStatusSet != true);
  }
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","WaitForStartStatus",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x8a0);
    fprintf(_stderr,"pthread primitive failure\n");
  }
  return this->m_fStartStatus;
}

Assistant:

bool
CPalThread::WaitForStartStatus(
    void
    )
{
    int iError;

    iError = pthread_mutex_lock(&m_startMutex);
    if (0 != iError)
    {
        ASSERT("pthread primitive failure\n");
        // bugcheck?
    }

    while (!m_fStartStatusSet)
    {
        iError = pthread_cond_wait(&m_startCond, &m_startMutex);
        if (0 != iError)
        {
            ASSERT("pthread primitive failure\n");
            // bugcheck?
        }
    }

    iError = pthread_mutex_unlock(&m_startMutex);
    if (0 != iError)
    {
        ASSERT("pthread primitive failure\n");
        // bugcheck?
    }

    return m_fStartStatus;
}